

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O2

uint emtgslbl(emtcxdef *ctx)

{
  ushort uVar1;
  uint uVar2;
  
  uVar1 = ctx->emtcxlfre;
  uVar2 = (uint)uVar1;
  if (uVar2 != 0xffff) {
    ctx->emtcxlfre = ctx->emtcxlbl[uVar2].emtllnk;
    ctx->emtcxlbl[uVar2].emtllnk = 0xffff;
    ctx->emtcxlbl[uVar2].emtlflg = '\x01';
    ctx->emtcxlbl[uVar2].emtlofs = ctx->emtcxofs;
    return (uint)uVar1;
  }
  errsigf(ctx->emtcxerr,"TADS",0x191);
}

Assistant:

uint emtgslbl(emtcxdef *ctx)
{
    uint ret = ctx->emtcxlfre;

    if (ctx->emtcxlfre == EMTLLNKEND) errsig(ctx->emtcxerr, ERR_NOLBL);
    ctx->emtcxlfre = ctx->emtcxlbl[ret].emtllnk;
    ctx->emtcxlbl[ret].emtllnk = EMTLLNKEND;     /* nothing in label's list */
    ctx->emtcxlbl[ret].emtlflg = EMTLFSET;          /* label is not yet set */
    ctx->emtcxlbl[ret].emtlofs = ctx->emtcxofs;             /* set position */
    return(ret);
}